

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastVerify.cpp
# Opt level: O2

void cast_verify::TestDouble(void)

{
  ostream *poVar1;
  CastTest<double> *tests_00;
  uint i;
  long lVar2;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  test;
  CastTest<double> tests [5];
  
  tests_00 = tests;
  InitializeCastArray<double>(tests_00,5);
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    test.m_int = 0;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&test,&tests_00->x);
    if (tests_00->fExpected != true) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"Error in cast double to std::uint64_t case ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    tests_00 = tests_00 + 1;
  }
  return;
}

Assistant:

void TestDouble()
	{
		CastTest<double> tests[5];

		InitializeCastArray(tests, _countof(tests));

		for (unsigned i = 0; i < _countof(tests); ++i)
		{
			SafeInt<std::uint64_t> test;
			bool fSuccess;

			try
			{
				test = tests[i].x;
				fSuccess = true;
			}
			catch (...)
			{
				fSuccess = false;
			}

			if(fSuccess != tests[i].fExpected)
				std::cerr << "Error in cast double to std::uint64_t case " << i << std::endl;
		}
	}